

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.cpp
# Opt level: O1

void CaDiCaL::catch_signal(int sig)

{
  double dVar1;
  
  if (sig == 0xe) {
    dVar1 = absolute_real_time();
    if ((double)alarm_time <= dVar1) {
      if (caught_alarm == '\0') {
        caught_alarm = '\x01';
        if (signal_handler != (long *)0x0) {
          (**(code **)(*signal_handler + 0x18))();
        }
      }
      if (alarm_set == '\x01') {
        signal(0xe,SIGALRM_handler);
        SIGALRM_handler = (__sighandler_t)0x0;
        caught_alarm = '\0';
        alarm_set = '\0';
        alarm_time = -1;
      }
      return;
    }
  }
  if (caught_signal == '\0') {
    caught_signal = '\x01';
    if (signal_handler != (long *)0x0) {
      (**(code **)(*signal_handler + 0x10))(signal_handler,sig);
    }
  }
  Signal::reset();
  raise(sig);
  return;
}

Assistant:

static void catch_signal (int sig) {
#ifndef __WIN32
  if (sig == SIGALRM && absolute_real_time () >= alarm_time) {
    if (!caught_alarm) {
      caught_alarm = true;
      if (signal_handler)
        signal_handler->catch_alarm ();
    }
    Signal::reset_alarm ();
  } else
#endif
  {
    if (!caught_signal) {
      caught_signal = true;
      if (signal_handler)
        signal_handler->catch_signal (sig);
    }
    Signal::reset ();
    ::raise (sig);
  }
}